

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_gamma_file3.hpp
# Opt level: O1

pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
* __thiscall
packed_gamma_file3<unsigned_int,_6UL>::run_length_encode
          (pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           *__return_storage_ptr__,packed_gamma_file3<unsigned_int,_6UL> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *V)

{
  iterator iVar1;
  pointer puVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint *__args;
  uint uVar8;
  uint local_3c;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_38;
  
  (__return_storage_ptr__->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c = 1;
  puVar2 = (V->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(V->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar2;
  if (lVar3 != 0) {
    uVar4 = lVar3 >> 2;
    local_38 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&__return_storage_ptr__->second;
    uVar5 = 1;
    uVar7 = 0;
    do {
      uVar6 = (ulong)uVar5;
      if ((uVar4 - 1 == uVar7) || (puVar2[uVar7] != puVar2[uVar6])) {
        iVar1._M_current =
             (__return_storage_ptr__->first).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->first).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                     iVar1,&local_3c);
        }
        else {
          *iVar1._M_current = local_3c;
          (__return_storage_ptr__->first).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        __args = (V->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start + uVar7;
        iVar1._M_current =
             (__return_storage_ptr__->second).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->second).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          uVar8 = 1;
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(local_38,iVar1,__args);
        }
        else {
          *iVar1._M_current = *__args;
          (__return_storage_ptr__->second).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          uVar8 = 1;
        }
      }
      else {
        uVar8 = local_3c + 1;
      }
      puVar2 = (V->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = (long)(V->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2 >> 2;
      uVar5 = uVar5 + 1;
      uVar7 = uVar6;
      local_3c = uVar8;
    } while (uVar6 < uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

pair<vector<itype>, vector<itype> > run_length_encode(vector<itype> & V){

		pair<vector<itype>, vector<itype> > R;
		itype l = 1;
		itype n = 0;

		for(itype i=0;i<V.size();++i){

			if(i == V.size()-1 || V[i] != V[i+1]){

				R.first.push_back(l);
				R.second.push_back(V[i]);

				n+=l;

				l = 1;

			}else{

				++l;

			}

		}

		assert(n == V.size());

		return R;

	}